

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

void __thiscall cmUVReadOnlyProcess::UVPipeOutEnd(cmUVReadOnlyProcess *this,ssize_t error)

{
  bool bVar1;
  ProcessResultT *pPVar2;
  string local_38;
  ssize_t local_18;
  ssize_t error_local;
  cmUVReadOnlyProcess *this_local;
  
  local_18 = error;
  error_local = (ssize_t)this;
  if (error != 0) {
    pPVar2 = Result(this);
    bVar1 = cmWorkerPool::ProcessResultT::error(pPVar2);
    if (!bVar1) {
      pPVar2 = Result(this);
      std::__cxx11::string::operator=
                ((string *)&pPVar2->ErrorMessage,
                 "Reading from stdout pipe failed with libuv error code ");
      std::__cxx11::to_string(&local_38,local_18);
      pPVar2 = Result(this);
      std::__cxx11::string::operator+=((string *)&pPVar2->ErrorMessage,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  UVTryFinish(this);
  return;
}

Assistant:

void cmUVReadOnlyProcess::UVPipeOutEnd(ssize_t error)
{
  // Process pipe error
  if ((error != 0) && !Result()->error()) {
    Result()->ErrorMessage =
      "Reading from stdout pipe failed with libuv error code ";
    Result()->ErrorMessage += std::to_string(error);
  }
  // Try finish
  UVTryFinish();
}